

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
ser::Serializer::fieldnames_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Serializer *this)

{
  bool bVar1;
  int iVar2;
  pointer __x;
  _Self local_40;
  _Self local_38;
  const_iterator iter;
  Serializer *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  iVar2 = FieldsTable::size(&this->fieldsTable_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,(long)iVar2);
  local_38._M_node = (_Base_ptr)FieldsTable::begin_abi_cxx11_(&this->fieldsTable_);
  while( true ) {
    local_40._M_node = (_Base_ptr)FieldsTable::end_abi_cxx11_(&this->fieldsTable_);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    __x = std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>
          ::operator->(&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&__x->first);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>
    ::operator++(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Serializer::fieldnames() const
{
    std::vector<std::string> ret;
    ret.reserve(fieldsTable_.size());
    for (FieldsTable::const_iterator iter = fieldsTable_.begin(); iter != fieldsTable_.end(); ++iter)
        ret.push_back(iter->first);
    return ret;
}